

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O0

light_pcapng_t * light_pcapng_open_write(char *file_path,light_pcapng_file_info *file_info)

{
  __fd_t pFVar1;
  light_pcapng p_Var2;
  light_option p_Var3;
  uint32_t *__ptr;
  light_pcapng_file_info *in_RSI;
  light_pcapng in_RDI;
  uint32_t *file_memory;
  size_t section_memory_size;
  light_pcapng iface_block_pcapng;
  _light_interface_description_block interface_block;
  int i;
  light_option new_opt_3;
  light_option new_opt_2;
  light_option new_opt_1;
  light_option new_opt;
  _light_section_header section_header;
  light_pcapng_t *pcapng;
  void *x_ret_1;
  void *x_ret;
  size_t count;
  light_pcapng in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  ushort in_stack_ffffffffffffff94;
  uint16_t in_stack_ffffffffffffff96;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar4;
  light_option in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  light_boolean copy;
  light_option in_stack_ffffffffffffffb8;
  undefined4 uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  light_pcapng section;
  light_pcapng_t *local_8;
  
  copy = (light_boolean)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (in_RSI == (light_pcapng_file_info *)0x0) {
    fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
            ,"light_pcapng_open_write",0xcb);
    local_8 = (light_pcapng_t *)0x0;
  }
  else if (in_RDI == (light_pcapng)0x0) {
    fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
            ,"light_pcapng_open_write",0xcc);
    local_8 = (light_pcapng_t *)0x0;
  }
  else {
    local_8 = (light_pcapng_t *)calloc(1,0x20);
    pFVar1 = light_open((char *)CONCAT26(in_stack_ffffffffffffff96,
                                         CONCAT24(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90)),
                        (__read_mode_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    local_8->file = pFVar1;
    local_8->file_info = in_RSI;
    uVar5 = 0x1a2b3c4d;
    uVar6 = in_RSI->major_version;
    uVar7 = in_RSI->minor_version;
    section = (light_pcapng)0xffffffffffffffff;
    p_Var2 = light_alloc_block((uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                               (uint32_t *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               CONCAT22(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94));
    local_8->pcapng = p_Var2;
    if (in_RSI->file_comment_size != 0) {
      in_stack_ffffffffffffffb8 =
           light_create_option(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94,
                               in_stack_ffffffffffffff88);
      light_add_option(section,(light_pcapng)CONCAT26(uVar7,CONCAT24(uVar6,uVar5)),
                       in_stack_ffffffffffffffb8,copy);
    }
    if (in_RSI->hardware_desc_size != 0) {
      p_Var3 = light_create_option(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94,
                                   in_stack_ffffffffffffff88);
      copy = (light_boolean)((ulong)p_Var3 >> 0x20);
      light_add_option(section,(light_pcapng)CONCAT26(uVar7,CONCAT24(uVar6,uVar5)),
                       in_stack_ffffffffffffffb8,copy);
    }
    if (in_RSI->os_desc_size != 0) {
      light_create_option(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94,
                          in_stack_ffffffffffffff88);
      light_add_option(section,(light_pcapng)CONCAT26(uVar7,CONCAT24(uVar6,uVar5)),
                       in_stack_ffffffffffffffb8,copy);
    }
    if (in_RSI->user_app_desc_size != 0) {
      in_stack_ffffffffffffffa0 =
           light_create_option(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94,
                               in_stack_ffffffffffffff88);
      light_add_option(section,(light_pcapng)CONCAT26(uVar7,CONCAT24(uVar6,uVar5)),
                       in_stack_ffffffffffffffb8,copy);
    }
    local_8->pcapng_iter = local_8->pcapng;
    for (uVar4 = 0; (ulong)(long)(int)uVar4 < in_RSI->interface_block_count; uVar4 = uVar4 + 1) {
      in_stack_ffffffffffffff94 = in_RSI->link_types[(int)uVar4];
      in_stack_ffffffffffffff96 = 0;
      in_stack_ffffffffffffff88 =
           light_alloc_block((uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                             (uint32_t *)((ulong)uVar4 << 0x20),(uint)in_stack_ffffffffffffff94);
      light_add_block(local_8->pcapng_iter,in_stack_ffffffffffffff88);
      local_8->pcapng_iter = in_stack_ffffffffffffff88;
    }
    count = 0;
    __ptr = light_pcapng_to_memory(in_RDI,(size_t *)local_8);
    light_write((__fd_t)CONCAT26(in_stack_ffffffffffffff96,
                                 CONCAT24(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)),
                in_stack_ffffffffffffff88,count);
    free(__ptr);
  }
  return local_8;
}

Assistant:

light_pcapng_t *light_pcapng_open_write(const char* file_path, light_pcapng_file_info *file_info)
{
	DCHECK_NULLP(file_info, return NULL);
	DCHECK_NULLP(file_path, return NULL);

	light_pcapng_t *pcapng = calloc(1, sizeof(struct _light_pcapng_t));
	pcapng->file = light_open(file_path, LIGHT_OWRITE);
	pcapng->file_info = file_info;

	struct _light_section_header section_header;
	section_header.byteorder_magic = BYTE_ORDER_MAGIC;
	section_header.major_version = file_info->major_version;
	section_header.minor_version = file_info->minor_version;
	section_header.section_length = 0xFFFFFFFFFFFFFFFFULL;
	pcapng->pcapng = light_alloc_block(LIGHT_SECTION_HEADER_BLOCK, (const uint32_t*)&section_header, sizeof(section_header)+3*sizeof(uint32_t));

	if (file_info->file_comment_size > 0)
	{
		light_option new_opt = light_create_option(LIGHT_OPTION_COMMENT, file_info->file_comment_size, file_info->file_comment);
		light_add_option(pcapng->pcapng, pcapng->pcapng, new_opt, LIGHT_FALSE);
	}

	if (file_info->hardware_desc_size > 0)
	{
		light_option new_opt = light_create_option(LIGHT_OPTION_SHB_HARDWARE, file_info->hardware_desc_size, file_info->hardware_desc);
		light_add_option(pcapng->pcapng, pcapng->pcapng, new_opt, LIGHT_FALSE);
	}

	if (file_info->os_desc_size > 0)
	{
		light_option new_opt = light_create_option(LIGHT_OPTION_SHB_OS, file_info->os_desc_size, file_info->os_desc);
		light_add_option(pcapng->pcapng, pcapng->pcapng, new_opt, LIGHT_FALSE);
	}

	if (file_info->user_app_desc_size > 0)
	{
		light_option new_opt = light_create_option(LIGHT_OPTION_SHB_USERAPPL, file_info->user_app_desc_size, file_info->user_app_desc);
		light_add_option(pcapng->pcapng, pcapng->pcapng, new_opt, LIGHT_FALSE);
	}

	pcapng->pcapng_iter = pcapng->pcapng;
	int i = 0;
	for (i = 0; i < file_info->interface_block_count; i++)
	{
		struct _light_interface_description_block interface_block;
		interface_block.link_type = file_info->link_types[i];
		interface_block.reserved = 0;
		interface_block.snapshot_length = 0;

		light_pcapng iface_block_pcapng = light_alloc_block(LIGHT_INTERFACE_BLOCK, (const uint32_t*)&interface_block, sizeof(struct _light_interface_description_block)+3*sizeof(uint32_t));
		light_add_block(pcapng->pcapng_iter, iface_block_pcapng);
		pcapng->pcapng_iter = iface_block_pcapng;
	}

	size_t section_memory_size = 0;
	uint32_t *file_memory = light_pcapng_to_memory(pcapng->pcapng, &section_memory_size);
	light_write(pcapng->file, file_memory, section_memory_size);
	free(file_memory);

	return pcapng;
}